

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_sptfqmr.c
# Opt level: O3

int SUNLinSolSpace_SPTFQMR(SUNLinearSolver S,long *lenrwLS,long *leniwLS)

{
  N_Vector v;
  sunindextype lrw1;
  sunindextype liw1;
  long local_30;
  long local_28;
  
  v = *(N_Vector *)((long)S->content + 0x90);
  if (v->ops->nvspace == (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
    local_28 = 0;
    local_30 = 0;
  }
  else {
    N_VSpace(v,&local_30,&local_28);
    local_30 = local_30 * 0xb;
    local_28 = local_28 * 0xb;
  }
  *lenrwLS = local_30;
  *leniwLS = local_28;
  return 0;
}

Assistant:

int SUNLinSolSpace_SPTFQMR(SUNLinearSolver S, 
                           long int *lenrwLS, 
                           long int *leniwLS)
{
  sunindextype liw1, lrw1;
  if (SPTFQMR_CONTENT(S)->vtemp1->ops->nvspace)
    N_VSpace(SPTFQMR_CONTENT(S)->vtemp1, &lrw1, &liw1);
  else
    lrw1 = liw1 = 0;
  *lenrwLS = lrw1*11;
  *leniwLS = liw1*11;
  return(SUNLS_SUCCESS);
}